

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O0

test_suite * init_unit_test_suite(int argc,char **argv)

{
  test_suite *ptVar1;
  test_suite *this;
  test_case *expected_failures;
  test_suite *ts;
  _func_void *in_stack_fffffffffffffa98;
  char *f;
  param_test_case_generator<avro::json::TestData<bool>,_avro::json::TestData<bool>_*>
  *in_stack_fffffffffffffaa0;
  test_unit_generator *in_stack_fffffffffffffaa8;
  uint uVar2;
  test_suite *in_stack_fffffffffffffab0;
  test_unit *in_stack_fffffffffffffab8;
  test_suite *tu;
  test_suite *in_stack_fffffffffffffac0;
  TestData<double> *in_stack_fffffffffffffb08;
  TestData<const_char_*> *par_begin;
  size_t in_stack_fffffffffffffb10;
  const_string *in_stack_fffffffffffffb18;
  const_string *tc_file;
  const_string *in_stack_fffffffffffffb20;
  basic_cstring<const_char> *this_00;
  const_string *in_stack_fffffffffffffb28;
  const_string *tc_name;
  function<void_()> *in_stack_fffffffffffffb30;
  test_suite *test_func;
  size_t in_stack_fffffffffffffb38;
  TestData<bool> *in_stack_fffffffffffffb40;
  TestData<const_char_*> *par_end;
  const_string *in_stack_fffffffffffffb48;
  test_suite *in_stack_fffffffffffffb50;
  basic_cstring<const_char> local_458 [4];
  basic_cstring<const_char> local_418 [4];
  basic_cstring<const_char> local_3d8 [4];
  basic_cstring<const_char> local_398 [4];
  basic_cstring<const_char> local_358 [4];
  basic_cstring<const_char> local_318 [3];
  undefined1 local_2e8 [32];
  const_string local_2c8 [7];
  const_string local_250;
  basic_cstring<const_char> local_240 [9];
  TestData<const_char_*> local_1a8 [6];
  basic_cstring<const_char> local_110 [9];
  basic_cstring<const_char> local_78 [6];
  test_suite *local_18;
  
  ptVar1 = (test_suite *)operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::test_suite::test_suite
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             (const_string *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  local_18 = ptVar1;
  boost::function<void()>::function<void(*)()>
            ((function<void_()> *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_78,"&avro::json::testNull",0x15);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::make_test_case
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             (size_t)in_stack_fffffffffffffb18);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (counter_t)in_stack_fffffffffffffab0,(uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
  boost::function<void_()>::~function((function<void_()> *)0x216653);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_110,"&avro::json::testBool",0x15);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::make_test_case<avro::json::TestData<bool>const&,avro::json::TestData<bool>*>
            ((_func_void_TestData<bool>_ptr *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
             (TestData<bool> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb40);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
             (uint)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<bool>,_avro::json::TestData<bool>_*>::
  ~param_test_case_generator(in_stack_fffffffffffffaa0);
  par_end = local_1a8;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)par_end,"&avro::json::testLong",0x15);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::make_test_case<avro::json::TestData<long>const&,avro::json::TestData<long>*>
            ((_func_void_TestData<long>_ptr *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
             (TestData<long> *)in_stack_fffffffffffffb08,(TestData<long> *)par_end);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
             (uint)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<long>,_avro::json::TestData<long>_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<long>,_avro::json::TestData<long>_*> *)
             in_stack_fffffffffffffaa0);
  this_00 = local_240;
  test_func = local_18;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (this_00,"&avro::json::testDouble",0x17);
  tc_name = &local_250;
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::make_test_case<avro::json::TestData<double>const&,avro::json::TestData<double>*>
            ((_func_void_TestData<double>_ptr *)tc_name,this_00,in_stack_fffffffffffffb18,
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(TestData<double> *)par_end);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
             (uint)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<double>,_avro::json::TestData<double>_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<double>,_avro::json::TestData<double>_*>
              *)in_stack_fffffffffffffaa0);
  ptVar1 = local_18;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)(local_2e8 + 0x10),"&avro::json::testString",0x17);
  par_begin = (TestData<const_char_*> *)local_2e8;
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  f = boost::debug::anon_unknown_0::prepare_gdb_cmnd_file::cmd_file_name;
  tc_file = local_2c8;
  boost::unit_test::
  make_test_case<avro::json::TestData<char_const*>const&,avro::json::TestData<char_const*>*>
            ((_func_void_TestData<const_char_ptr>_ptr *)tc_name,this_00,tc_file,(size_t)ptVar1,
             par_begin,par_end);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
             (uint)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
  uVar2 = (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<const_char_*>,_avro::json::TestData<const_char_*>_*>
  ::~param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<const_char_*>,_avro::json::TestData<const_char_*>_*>
              *)in_stack_fffffffffffffaa0);
  boost::function<void()>::function<void(*)()>
            ((function<void_()> *)in_stack_fffffffffffffaa0,(_func_void *)f,0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_318,"&avro::json::testArray0",0x17);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::make_test_case((function<void_()> *)test_func,tc_name,this_00,(size_t)tc_file);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (counter_t)in_stack_fffffffffffffab0,uVar2);
  boost::function<void_()>::~function((function<void_()> *)0x2169c7);
  boost::function<void()>::function<void(*)()>
            ((function<void_()> *)in_stack_fffffffffffffaa0,(_func_void *)f,0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_358,"&avro::json::testArray1",0x17);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::make_test_case((function<void_()> *)test_func,tc_name,this_00,(size_t)tc_file);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (counter_t)in_stack_fffffffffffffab0,uVar2);
  boost::function<void_()>::~function((function<void_()> *)0x216a66);
  boost::function<void()>::function<void(*)()>
            ((function<void_()> *)in_stack_fffffffffffffaa0,(_func_void *)f,0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_398,"&avro::json::testArray2",0x17);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  boost::unit_test::make_test_case((function<void_()> *)test_func,tc_name,this_00,(size_t)tc_file);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (counter_t)in_stack_fffffffffffffab0,uVar2);
  boost::function<void_()>::~function((function<void_()> *)0x216b05);
  boost::function<void()>::function<void(*)()>
            ((function<void_()> *)in_stack_fffffffffffffaa0,(_func_void *)f,0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_3d8,"&avro::json::testObject0",0x18);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffffac0,
             (pointer)in_stack_fffffffffffffab8);
  this = (test_suite *)
         boost::unit_test::make_test_case
                   ((function<void_()> *)test_func,tc_name,this_00,(size_t)tc_file);
  boost::unit_test::test_suite::add
            (this,in_stack_fffffffffffffab8,(counter_t)in_stack_fffffffffffffab0,uVar2);
  boost::function<void_()>::~function((function<void_()> *)0x216ba4);
  tu = local_18;
  boost::function<void()>::function<void(*)()>
            ((function<void_()> *)in_stack_fffffffffffffaa0,(_func_void *)f,0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_418,"&avro::json::testObject1",0x18);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(pointer)tu);
  expected_failures =
       boost::unit_test::make_test_case
                 ((function<void_()> *)test_func,tc_name,this_00,(size_t)tc_file);
  boost::unit_test::test_suite::add(this,(test_unit *)tu,(counter_t)expected_failures,uVar2);
  boost::function<void_()>::~function((function<void_()> *)0x216c43);
  ptVar1 = local_18;
  boost::function<void()>::function<void(*)()>
            ((function<void_()> *)in_stack_fffffffffffffaa0,(_func_void *)f,0);
  uVar2 = (uint)((ulong)ptVar1 >> 0x20);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_458,"&avro::json::testObject2",0x18);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(pointer)tu);
  boost::unit_test::make_test_case((function<void_()> *)test_func,tc_name,this_00,(size_t)tc_file);
  boost::unit_test::test_suite::add(this,(test_unit *)tu,(counter_t)expected_failures,uVar2);
  boost::function<void_()>::~function((function<void_()> *)0x216ce2);
  return local_18;
}

Assistant:

boost::unit_test::test_suite*
init_unit_test_suite( int argc, char* argv[] ) 
{
    using namespace boost::unit_test;

    test_suite* ts= BOOST_TEST_SUITE("Avro C++ unit tests for json routines");

    ts->add(BOOST_TEST_CASE(&avro::json::testNull));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testBool,
        avro::json::boolData,
        avro::json::boolData + COUNTOF(avro::json::boolData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testLong,
        avro::json::longData,
        avro::json::longData + COUNTOF(avro::json::longData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testDouble,
        avro::json::doubleData,
        avro::json::doubleData + COUNTOF(avro::json::doubleData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testString,
        avro::json::stringData,
        avro::json::stringData + COUNTOF(avro::json::stringData)));

    ts->add(BOOST_TEST_CASE(&avro::json::testArray0));
    ts->add(BOOST_TEST_CASE(&avro::json::testArray1));
    ts->add(BOOST_TEST_CASE(&avro::json::testArray2));

    ts->add(BOOST_TEST_CASE(&avro::json::testObject0));
    ts->add(BOOST_TEST_CASE(&avro::json::testObject1));
    ts->add(BOOST_TEST_CASE(&avro::json::testObject2));

    return ts;
}